

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj.c
# Opt level: O3

int Maj_ManExactSynthesis(int nVars,int nNodes,int fUseConst,int fUseLine,int fVerbose)

{
  word *pwVar1;
  ulong uVar2;
  bmcg_sat_solver *s;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Maj_Man_t *p;
  long lVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  int level;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int (*paaiVar14) [3] [32];
  ulong uVar15;
  int iMint;
  timespec ts;
  uint local_90;
  uint local_8c;
  timespec local_88;
  long local_78;
  long local_70;
  int local_64;
  ulong local_60;
  bmcg_sat_solver *local_58;
  int (*local_50) [3] [32];
  int (*local_48) [3] [32];
  long local_40;
  Maj_Man_t *local_38;
  
  local_90 = 0;
  local_64 = fVerbose;
  iVar3 = clock_gettime(3,&local_88);
  if (iVar3 < 0) {
    local_70 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
    local_70 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_88.tv_sec * -1000000;
  }
  p = Maj_ManAlloc(nVars,nNodes,fUseConst,fUseLine);
  iVar3 = Maj_ManAddCnfStart(p);
  if (iVar3 == 0) {
    __assert_fail("status",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                  ,0x174,"int Maj_ManExactSynthesis(int, int, int, int, int)");
  }
  printf("Running exact synthesis for %d-input majority with %d MAJ3 gates...\n",
         (ulong)(uint)p->nVars,(ulong)(uint)p->nNodes);
  if (local_90 != 0xffffffff) {
    local_50 = p->VarMarks + 2;
    local_8c = 0;
    local_38 = p;
    do {
      iVar3 = clock_gettime(3,&local_88);
      if (iVar3 < 0) {
        lVar7 = 1;
      }
      else {
        lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_88.tv_nsec),8);
        lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_88.tv_sec * -1000000;
      }
      iVar3 = Maj_ManAddCnf(p,local_90);
      if (iVar3 == 0) {
LAB_005a3955:
        if (local_90 != 0xffffffff) goto LAB_005a3964;
        break;
      }
      local_58 = p->pSat;
      iVar3 = bmcg_sat_solver_solve(local_58,(int *)0x0,0);
      if (local_64 != 0) {
        printf("Iter %3d : ",(ulong)local_8c);
        Extra_PrintBinary(_stdout,&local_90,p->nVars);
        printf("  Var =%5d  ",(ulong)(uint)p->iVar);
        s = local_58;
        uVar4 = bmcg_sat_solver_clausenum(local_58);
        printf("Cla =%6d  ",(ulong)uVar4);
        uVar4 = bmcg_sat_solver_conflictnum(s);
        printf("Conf =%9d  ",(ulong)uVar4);
        level = 3;
        iVar5 = clock_gettime(3,&local_88);
        if (iVar5 < 0) {
          lVar9 = -1;
        }
        else {
          lVar9 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
        }
        Abc_Print(level,"%s =","Time");
        Abc_Print(level,"%9.2f sec\n",(double)(lVar9 + lVar7) / 1000000.0);
      }
      if (iVar3 == -1) {
        puts("The problem has no solution.");
        goto LAB_005a3955;
      }
      local_60 = (ulong)p->nVars;
      uVar4 = p->nObjs;
      if (p->nVars + 2 < (int)uVar4) {
        lVar7 = local_60 + 2;
        paaiVar14 = local_50 + local_60;
        do {
          lVar9 = 0;
          local_48 = paaiVar14;
          local_40 = lVar7;
          do {
            if ((int)uVar4 < 1) {
LAB_005a3a27:
              __assert_fail("Count == 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                            ,0xb6,"int Maj_ManFindFanin(Maj_Man_t *, int, int)");
            }
            uVar15 = 0;
            uVar10 = 0xffffffff;
            iVar3 = 0;
            do {
              iVar5 = (*paaiVar14)[0][uVar15];
              if (iVar5 != 0) {
                iVar5 = bmcg_sat_solver_read_cex_varvalue(local_58,iVar5);
                if (iVar5 != 0) {
                  uVar10 = uVar15 & 0xffffffff;
                }
                iVar3 = iVar3 + (uint)(iVar5 != 0);
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 < uVar4);
            if (iVar3 != 1) goto LAB_005a3a27;
            uVar6 = local_38->nWords;
            uVar8 = (int)uVar10 * uVar6;
            if ((int)uVar8 < 0) goto LAB_005a3a08;
            uVar11 = local_38->vInfo->nSize;
            if ((int)uVar11 <= (int)uVar8) goto LAB_005a3a08;
            pwVar1 = local_38->vInfo->pArray;
            (&local_88.tv_sec)[lVar9] = (__time_t)(pwVar1 + uVar8);
            lVar9 = lVar9 + 1;
            paaiVar14 = (int (*) [3] [32])(*paaiVar14 + 1);
          } while (lVar9 != 3);
          uVar8 = (int)local_40 * uVar6;
          if (((int)uVar8 < 0) || (uVar11 <= uVar8)) goto LAB_005a3a08;
          if (0 < (int)uVar6) {
            uVar10 = 0;
            do {
              uVar15 = *(ulong *)(local_88.tv_nsec + uVar10 * 8);
              uVar2 = *(ulong *)(local_78 + uVar10 * 8);
              pwVar1[(int)local_40 * uVar6 + uVar10] =
                   uVar2 & uVar15 | (uVar2 | uVar15) & *(ulong *)(local_88.tv_sec + uVar10 * 8);
              uVar10 = uVar10 + 1;
            } while (uVar6 != uVar10);
          }
          lVar7 = local_40 + 1;
          paaiVar14 = local_48 + 1;
          p = local_38;
        } while (lVar7 < (long)(ulong)uVar4);
      }
      uVar8 = 1 << ((byte)local_60 & 0x1f);
      uVar6 = 0xffffffff;
      if ((int)local_60 != 0x1f) {
        iVar3 = (int)(((uint)(local_60 >> 0x1f) & 1) + (int)local_60) >> 1;
        uVar11 = 1;
        if (1 < (int)uVar8) {
          uVar11 = uVar8;
        }
        uVar10 = 0;
        do {
          if ((iVar3 <= Abc_TtBitCount8[uVar10 >> 8] + Abc_TtBitCount8[uVar10 & 0xff]) &&
             (Abc_TtBitCount8[uVar10 >> 8] + Abc_TtBitCount8[uVar10 & 0xff] <= iVar3 + 1)) {
            uVar13 = p->nWords * uVar4;
            if ((int)uVar13 < 0) {
LAB_005a3a08:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                            ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
            }
            uVar6 = p->vInfo->nSize;
            if ((((int)uVar6 <= (int)uVar13) || (uVar12 = p->nWords * (uVar4 - 1), (int)uVar12 < 0))
               || (uVar6 <= uVar12)) goto LAB_005a3a08;
            pwVar1 = p->vInfo->pArray;
            uVar6 = (uint)uVar10;
            if (((pwVar1[(ulong)uVar12 + (uVar10 >> 6)] ^ pwVar1[(ulong)uVar13 + (uVar10 >> 6)]) >>
                 (uVar10 & 0x3f) & 1) != 0) break;
          }
          uVar13 = (uint)uVar10 + 1;
          uVar10 = (ulong)uVar13;
          uVar6 = 0xffffffff;
        } while (uVar11 != uVar13);
      }
      if ((int)uVar8 <= (int)uVar6) {
        __assert_fail("iMint < (1 << p->nVars)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcMaj.c"
                      ,0xda,"int Maj_ManEval(Maj_Man_t *)");
      }
      local_8c = local_8c + 1;
      local_90 = uVar6;
    } while (uVar6 != 0xffffffff);
  }
  Maj_ManPrintSolution(p);
LAB_005a3964:
  Maj_ManFree(p);
  iVar5 = 3;
  iVar3 = clock_gettime(3,&local_88);
  if (iVar3 < 0) {
    lVar7 = -1;
  }
  else {
    lVar7 = local_88.tv_nsec / 1000 + local_88.tv_sec * 1000000;
  }
  lVar7 = lVar7 + local_70;
  Abc_Print(iVar5,"%s =","Total runtime");
  Abc_Print(iVar5,"%9.2f sec\n",(double)lVar7 / 1000000.0);
  return (int)(local_90 == 0xffffffff);
}

Assistant:

int Maj_ManExactSynthesis( int nVars, int nNodes, int fUseConst, int fUseLine, int fVerbose )
{
    int i, iMint = 0;
    abctime clkTotal = Abc_Clock();
    Maj_Man_t * p = Maj_ManAlloc( nVars, nNodes, fUseConst, fUseLine );
    int status = Maj_ManAddCnfStart( p );
    assert( status );
    printf( "Running exact synthesis for %d-input majority with %d MAJ3 gates...\n", p->nVars, p->nNodes );
    for ( i = 0; iMint != -1; i++ )
    {
        abctime clk = Abc_Clock();
        if ( !Maj_ManAddCnf( p, iMint ) )
            break;
        status = bmcg_sat_solver_solve( p->pSat, NULL, 0 );
        if ( fVerbose )
        {
            printf( "Iter %3d : ", i );
            Extra_PrintBinary( stdout, (unsigned *)&iMint, p->nVars );
            printf( "  Var =%5d  ", p->iVar );
            printf( "Cla =%6d  ", bmcg_sat_solver_clausenum(p->pSat) );
            printf( "Conf =%9d  ", bmcg_sat_solver_conflictnum(p->pSat) );
            Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
        }
        if ( status == GLUCOSE_UNSAT )
        {
            printf( "The problem has no solution.\n" );
            break;
        }
        iMint = Maj_ManEval( p );
    }
    if ( iMint == -1 )
        Maj_ManPrintSolution( p );
    Maj_ManFree( p );
    Abc_PrintTime( 1, "Total runtime", Abc_Clock() - clkTotal );
    return iMint == -1;
}